

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall tinyusdz::primvar::PrimVar::has_value(PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((this->_blocked == false) && (pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)
     ) {
    uVar2 = (*pvVar1->type_id)();
    if (uVar2 == 0) {
      bVar3 = false;
    }
    else {
      pvVar1 = (this->_value).v_.vtable;
      if (pvVar1 != (vtable_type *)0x0) {
        uVar2 = (*pvVar1->type_id)();
        bVar3 = uVar2 != 1;
      }
    }
  }
  return bVar3;
}

Assistant:

bool has_value() const {
    // ValueBlock is treated as having a value.
    if (_blocked) {
      return true;
    }
    return (_value.type_id() != value::TypeId::TYPE_ID_INVALID) && (_value.type_id() != value::TypeId::TYPE_ID_NULL);
  }